

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *os,Type type)

{
  ostream *poVar1;
  TypePrinter local_a0;
  
  anon_unknown_0::TypePrinter::TypePrinter(&local_a0,os);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_a0,type);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_a0);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Type type) {
  return TypePrinter(os).print(type);
}